

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

int nn_msgqueue_recv(nn_msgqueue *self,nn_msg *msg)

{
  nn_msgqueue_chunk *ptr;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (self->count != 0) {
    nn_msg_mv(msg,((self->in).chunk)->msgs + (self->in).pos);
    iVar1 = (self->in).pos + 1;
    (self->in).pos = iVar1;
    if (iVar1 == 0x7e) {
      ptr = (self->in).chunk;
      (self->in).chunk = ptr->next;
      (self->in).pos = 0;
      if (self->cache == (nn_msgqueue_chunk *)0x0) {
        self->cache = ptr;
      }
      else {
        nn_free(ptr);
      }
    }
    self->count = self->count - 1;
    sVar2 = nn_chunkref_size(&msg->sphdr);
    sVar3 = nn_chunkref_size(&msg->body);
    self->mem = self->mem - (sVar3 + sVar2);
    return 0;
  }
  return -0xb;
}

Assistant:

int nn_msgqueue_recv (struct nn_msgqueue *self, struct nn_msg *msg)
{
    struct nn_msgqueue_chunk *o;

    /*  If there is no message in the queue. */
    if (nn_slow (!self->count))
        return -EAGAIN;

    /*  Move the message from the pipe to the user. */
    nn_msg_mv (msg, &self->in.chunk->msgs [self->in.pos]);

    /*  Move to the next position. */
    ++self->in.pos;
    if (nn_slow (self->in.pos == NN_MSGQUEUE_GRANULARITY)) {
        o = self->in.chunk;
        self->in.chunk = self->in.chunk->next;
        self->in.pos = 0;
        if (nn_fast (!self->cache))
            self->cache = o;
        else
            nn_free (o);
    }

    /*  Adjust the statistics. */
    --self->count;
    self->mem -= (nn_chunkref_size (&msg->sphdr) +
        nn_chunkref_size (&msg->body));

    return 0;
}